

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  mbedtls_md_info_t *pmVar5;
  size_t sVar6;
  uchar *puVar7;
  uchar *input;
  bool bVar8;
  undefined4 local_4cc;
  byte local_4c8 [8];
  uchar buf [1024];
  mbedtls_md_context_t md_ctx;
  mbedtls_md_info_t *md_info;
  size_t msb;
  size_t slen;
  uchar local_90 [4];
  uint hlen;
  uchar zeros [8];
  uchar result [64];
  uchar *p;
  size_t siglen;
  int ret;
  uint hashlen_local;
  mbedtls_md_type_t md_alg_local;
  int mode_local;
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_rsa_context *ctx_local;
  
  if ((mode == 1) && (ctx->padding != 1)) {
    ctx_local._4_4_ = -0x4080;
  }
  else {
    puVar7 = (uchar *)ctx->len;
    if ((puVar7 < (uchar *)0x10) || ((uchar *)0x400 < puVar7)) {
      ctx_local._4_4_ = -0x4080;
    }
    else {
      if (mode == 0) {
        local_4cc = mbedtls_rsa_public(ctx,sig,local_4c8);
      }
      else {
        local_4cc = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,local_4c8);
      }
      if (local_4cc == 0) {
        result._56_8_ = local_4c8;
        if ((puVar7 + -0x4c9)[(long)&stack0x00000000] == 0xbc) {
          siglen._4_4_ = hashlen;
          if (md_alg != MBEDTLS_MD_NONE) {
            pmVar5 = mbedtls_md_info_from_type(md_alg);
            if (pmVar5 == (mbedtls_md_info_t *)0x0) {
              return -0x4080;
            }
            bVar2 = mbedtls_md_get_size(pmVar5);
            siglen._4_4_ = (uint)bVar2;
          }
          pmVar5 = mbedtls_md_info_from_type(mgf1_hash_id);
          if (pmVar5 == (mbedtls_md_info_t *)0x0) {
            ctx_local._4_4_ = -0x4080;
          }
          else {
            bVar2 = mbedtls_md_get_size(pmVar5);
            uVar3 = (uint)bVar2;
            memset(local_90,0,8);
            sVar6 = mbedtls_mpi_bitlen(&ctx->N);
            p = puVar7;
            if ((sVar6 - 1 & 7) == 0) {
              result._56_8_ = local_4c8 + 1;
              p = puVar7 + -1;
            }
            cVar1 = (char)(sVar6 - 1);
            if ((int)(uint)local_4c8[0] >> (('\b' - (char)((long)p << 3)) + cVar1 & 0x1fU) == 0) {
              mbedtls_md_init((mbedtls_md_context_t *)(buf + 0x3f8));
              ctx_local._4_4_ = mbedtls_md_setup((mbedtls_md_context_t *)(buf + 0x3f8),pmVar5,0);
              if (ctx_local._4_4_ == 0) {
                mgf_mask((uchar *)result._56_8_,(size_t)(p + (-1 - (ulong)uVar3)),
                         p + (result._56_8_ - (ulong)uVar3) + -1,(ulong)uVar3,
                         (mbedtls_md_context_t *)(buf + 0x3f8));
                local_4c8[0] = local_4c8[0] & (byte)(0xff >> ((char)((long)p << 3) - cVar1 & 0x1fU))
                ;
                while( true ) {
                  bVar8 = false;
                  if ((ulong)result._56_8_ < local_4c8 + (long)p) {
                    bVar8 = *(char *)result._56_8_ == '\0';
                  }
                  if (!bVar8) break;
                  result._56_8_ = result._56_8_ + 1;
                }
                if (((byte *)result._56_8_ == local_4c8 + (long)p) ||
                   (input = (uchar *)(result._56_8_ + 1), *(char *)result._56_8_ != '\x01')) {
                  mbedtls_md_free((mbedtls_md_context_t *)(buf + 0x3f8));
                  ctx_local._4_4_ = -0x4100;
                }
                else {
                  puVar7 = puVar7 + ((-1 - (ulong)uVar3) - ((long)input - (long)local_4c8));
                  if ((expected_salt_len == -1) || (puVar7 == (uchar *)(long)expected_salt_len)) {
                    mbedtls_md_starts((mbedtls_md_context_t *)(buf + 0x3f8));
                    mbedtls_md_update((mbedtls_md_context_t *)(buf + 0x3f8),local_90,8);
                    mbedtls_md_update((mbedtls_md_context_t *)(buf + 0x3f8),hash,(ulong)siglen._4_4_
                                     );
                    mbedtls_md_update((mbedtls_md_context_t *)(buf + 0x3f8),input,(size_t)puVar7);
                    mbedtls_md_finish((mbedtls_md_context_t *)(buf + 0x3f8),zeros);
                    mbedtls_md_free((mbedtls_md_context_t *)(buf + 0x3f8));
                    iVar4 = memcmp(input + (long)puVar7,zeros,(ulong)uVar3);
                    if (iVar4 == 0) {
                      ctx_local._4_4_ = 0;
                    }
                    else {
                      ctx_local._4_4_ = -0x4380;
                    }
                  }
                  else {
                    mbedtls_md_free((mbedtls_md_context_t *)(buf + 0x3f8));
                    ctx_local._4_4_ = -0x4100;
                  }
                }
              }
              else {
                mbedtls_md_free((mbedtls_md_context_t *)(buf + 0x3f8));
              }
            }
            else {
              ctx_local._4_4_ = -0x4080;
            }
          }
        }
        else {
          ctx_local._4_4_ = -0x4100;
        }
      }
      else {
        ctx_local._4_4_ = local_4cc;
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret;
    size_t siglen;
    unsigned char *p;
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t slen, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );
    slen = siglen - hlen - 1; /* Currently length of salt + padding */

    memset( zeros, 0, 8 );

    /*
     * Note: EMSA-PSS verification is over the length of N - 1 bits
     */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }
    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
    {
        mbedtls_md_free( &md_ctx );
        return( ret );
    }

    mgf_mask( p, siglen - hlen - 1, p + siglen - hlen - 1, hlen, &md_ctx );

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < buf + siglen && *p == 0 )
        p++;

    if( p == buf + siglen ||
        *p++ != 0x01 )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    /* Actual salt len */
    slen -= p - buf;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        slen != (size_t) expected_salt_len )
    {
        mbedtls_md_free( &md_ctx );
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );
    }

    /*
     * Generate H = Hash( M' )
     */
    mbedtls_md_starts( &md_ctx );
    mbedtls_md_update( &md_ctx, zeros, 8 );
    mbedtls_md_update( &md_ctx, hash, hashlen );
    mbedtls_md_update( &md_ctx, p, slen );
    mbedtls_md_finish( &md_ctx, result );

    mbedtls_md_free( &md_ctx );

    if( memcmp( p + slen, result, hlen ) == 0 )
        return( 0 );
    else
        return( MBEDTLS_ERR_RSA_VERIFY_FAILED );
}